

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O2

void __thiscall
cmLocalGenerator::cmLocalGenerator
          (cmLocalGenerator *this,cmGlobalGenerator *gg,cmMakefile *makefile)

{
  _Rb_tree_header *p_Var1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *this_00;
  cmMakefile *pcVar2;
  bool bVar3;
  cmValue cVar4;
  mapped_type *pmVar5;
  string *psVar6;
  mapped_type *pmVar7;
  long lVar8;
  long lVar9;
  pointer in_name;
  size_type i;
  ulong uVar10;
  pointer pbVar11;
  string_view str;
  string e;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  cpath;
  allocator<char> local_14a;
  allocator<char> local_149;
  string *local_148;
  cmList sysroots;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  string *local_e0;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *local_d8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_d0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  enabledLanguages;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string replaceVar;
  string local_50;
  
  cmMakefile::GetStateSnapshot(makefile);
  cmOutputConverter::cmOutputConverter(&this->super_cmOutputConverter,(cmStateSnapshot *)&e);
  (this->super_cmOutputConverter)._vptr_cmOutputConverter =
       (_func_int **)&PTR__cmLocalGenerator_00a9f470;
  cmMakefile::GetBacktrace((cmMakefile *)&this->DirectoryBacktrace);
  p_Var1 = &(this->UniqueObjectNamesMap)._M_t._M_impl.super__Rb_tree_header;
  (this->UniqueObjectNamesMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->UniqueObjectNamesMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->UniqueObjectNamesMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->UniqueObjectNamesMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->UniqueObjectNamesMap)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->ObjectMaxPathViolations)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->ObjectMaxPathViolations)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  p_Var1 = &(this->ObjectMaxPathViolations)._M_t._M_impl.super__Rb_tree_header;
  (this->ObjectMaxPathViolations)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->ObjectMaxPathViolations)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->ObjectMaxPathViolations)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->EnvCPATH).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->EnvCPATH).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->EnvCPATH).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->GeneratorTargetSearchIndex)._M_h._M_buckets =
       &(this->GeneratorTargetSearchIndex)._M_h._M_single_bucket;
  (this->GeneratorTargetSearchIndex)._M_h._M_bucket_count = 1;
  (this->GeneratorTargetSearchIndex)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->GeneratorTargetSearchIndex)._M_h._M_element_count = 0;
  (this->GeneratorTargetSearchIndex)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->WarnCMP0063)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->WarnCMP0063)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  p_Var1 = &(this->WarnCMP0063)._M_t._M_impl.super__Rb_tree_header;
  (this->GeneratorTargetSearchIndex)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->GeneratorTargetSearchIndex)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->GeneratorTargets).
  super__Vector_base<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>,_std::allocator<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->GeneratorTargets).
  super__Vector_base<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>,_std::allocator<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->GeneratorTargets).
  super__Vector_base<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>,_std::allocator<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->WarnCMP0063)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->WarnCMP0063)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->WarnCMP0063)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->ImportedGeneratorTargets)._M_h._M_buckets =
       &(this->ImportedGeneratorTargets)._M_h._M_single_bucket;
  (this->ImportedGeneratorTargets)._M_h._M_bucket_count = 1;
  (this->ImportedGeneratorTargets)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->ImportedGeneratorTargets)._M_h._M_element_count = 0;
  (this->ImportedGeneratorTargets)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->AliasTargets)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->AliasTargets)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  p_Var1 = &(this->AliasTargets)._M_t._M_impl.super__Rb_tree_header;
  (this->OwnedImportedGeneratorTargets).
  super__Vector_base<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>,_std::allocator<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->ImportedGeneratorTargets)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->ImportedGeneratorTargets)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->OwnedImportedGeneratorTargets).
  super__Vector_base<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>,_std::allocator<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->OwnedImportedGeneratorTargets).
  super__Vector_base<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>,_std::allocator<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->AliasTargets)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->AliasTargets)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->AliasTargets)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->Compilers)._M_t._M_impl.super__Rb_tree_header;
  (this->Compilers)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->Compilers)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->Compilers)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->Compilers)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->Compilers)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->VariableMappings)._M_t._M_impl.super__Rb_tree_header;
  (this->VariableMappings)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->VariableMappings)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->VariableMappings)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header
  ;
  (this->VariableMappings)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->VariableMappings)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this_00 = &this->VariableMappings;
  psVar6 = &this->CompilerSysroot;
  (this->CompilerSysroot)._M_dataplus._M_p = (pointer)&(this->CompilerSysroot).field_2;
  (this->CompilerSysroot)._M_string_length = 0;
  (this->CompilerSysroot).field_2._M_local_buf[0] = '\0';
  local_148 = (string *)&this->LinkerSysroot;
  (this->LinkerSysroot)._M_dataplus._M_p = (pointer)&(this->LinkerSysroot).field_2;
  (this->LinkerSysroot)._M_string_length = 0;
  (this->LinkerSysroot).field_2._M_local_buf[0] = '\0';
  (this->AppleArchSysroots)._M_h._M_buckets = &(this->AppleArchSysroots)._M_h._M_single_bucket;
  (this->AppleArchSysroots)._M_h._M_bucket_count = 1;
  (this->AppleArchSysroots)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->AppleArchSysroots)._M_h._M_element_count = 0;
  (this->AppleArchSysroots)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->AppleArchSysroots)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->AppleArchSysroots)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->OutputToSource)._M_h._M_buckets = &(this->OutputToSource)._M_h._M_single_bucket;
  (this->OutputToSource)._M_h._M_bucket_count = 1;
  (this->OutputToSource)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->OutputToSource)._M_h._M_element_count = 0;
  (this->OutputToSource)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->OutputToSource)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->OutputToSource)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  this->GlobalGenerator = gg;
  this->Makefile = makefile;
  local_e0 = psVar6;
  local_d8 = &this->AliasTargets;
  local_d0 = &this->EnvCPATH;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)&e,&(makefile->AliasTargets)._M_t);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::operator=(&(this->AliasTargets)._M_t,
              (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)&e);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)&e);
  this->EmitUniversalBinaryFlags = true;
  this->BackwardsCompatibility = 0;
  this->BackwardsCompatibilityFinal = false;
  ComputeObjectMaxPath(this);
  cpath.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  cpath.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  cpath.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cmsys::SystemTools::GetPath(&cpath,"CPATH");
  pbVar11 = cpath.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  for (in_name = cpath.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; in_name != pbVar11;
      in_name = in_name + 1) {
    bVar3 = cmsys::SystemTools::FileIsFullPath(in_name);
    if (bVar3) {
      cmsys::SystemTools::CollapseFullPath(&e,in_name);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 &this->EnvCPATH,&e);
      std::__cxx11::string::~string((string *)&e);
    }
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&cpath);
  cmState::GetEnabledLanguages_abi_cxx11_
            (&enabledLanguages,
             (this->GlobalGenerator->CMakeInstance->State)._M_t.
             super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
             super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
             super__Head_base<0UL,_cmState_*,_false>._M_head_impl);
  pcVar2 = this->Makefile;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&e,"CMAKE_SYSROOT_COMPILE",(allocator<char> *)&cpath);
  cVar4 = cmMakefile::GetDefinition(pcVar2,&e);
  std::__cxx11::string::~string((string *)&e);
  if (cVar4.Value == (string *)0x0) {
    pcVar2 = this->Makefile;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&e,"CMAKE_SYSROOT",(allocator<char> *)&cpath);
    cmMakefile::GetSafeDefinition(pcVar2,&e);
    std::__cxx11::string::_M_assign((string *)psVar6);
    std::__cxx11::string::~string((string *)&e);
  }
  else {
    std::__cxx11::string::_M_assign((string *)psVar6);
  }
  pcVar2 = this->Makefile;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&e,"CMAKE_SYSROOT_LINK",(allocator<char> *)&cpath);
  cVar4 = cmMakefile::GetDefinition(pcVar2,&e);
  std::__cxx11::string::~string((string *)&e);
  if (cVar4.Value == (string *)0x0) {
    pcVar2 = this->Makefile;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&e,"CMAKE_SYSROOT",(allocator<char> *)&cpath);
    cmMakefile::GetSafeDefinition(pcVar2,&e);
    std::__cxx11::string::_M_assign(local_148);
    std::__cxx11::string::~string((string *)&e);
  }
  else {
    std::__cxx11::string::_M_assign(local_148);
  }
  pcVar2 = this->Makefile;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&e,"CMAKE_OSX_SYSROOT",(allocator<char> *)&cpath);
  cVar4 = cmMakefile::GetDefinition(pcVar2,&e);
  std::__cxx11::string::~string((string *)&e);
  if ((cVar4.Value == (string *)0x0) || ((cVar4.Value)->_M_string_length == 0)) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&e,"/",&local_149);
  }
  else {
    str._M_str = ((cVar4.Value)->_M_dataplus)._M_p;
    str._M_len = (cVar4.Value)->_M_string_length;
    cmOutputConverter::EscapeForShell_abi_cxx11_
              (&e,&this->super_cmOutputConverter,str,true,false,false,false,false);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&cpath,"CMAKE_OSX_SYSROOT",(allocator<char> *)&sysroots);
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](this_00,(key_type *)&cpath);
  std::__cxx11::string::operator=((string *)pmVar5,(string *)&e);
  std::__cxx11::string::~string((string *)&cpath);
  std::__cxx11::string::~string((string *)&e);
  pcVar2 = this->Makefile;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&e,"CMAKE_APPLE_ARCH_SYSROOTS",(allocator<char> *)&cpath);
  cVar4 = cmMakefile::GetDefinition(pcVar2,&e);
  std::__cxx11::string::~string((string *)&e);
  if (cVar4.Value != (string *)0x0) {
    pcVar2 = this->Makefile;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&e,"CMAKE_OSX_ARCHITECTURES",(allocator<char> *)&cpath);
    psVar6 = cmMakefile::GetSafeDefinition(pcVar2,&e);
    std::__cxx11::string::~string((string *)&e);
    cmList::cmList((cmList *)&cpath,psVar6,Yes,No);
    cmList::cmList(&sysroots,cVar4,Yes);
    if ((long)cpath.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)cpath.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start ==
        (long)sysroots.Values.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)sysroots.Values.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start) {
      lVar9 = 0;
      for (uVar10 = 0;
          uVar10 < (ulong)((long)cpath.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                           (long)cpath.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start >> 5);
          uVar10 = uVar10 + 1) {
        pmVar7 = std::__detail::
                 _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                 ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                               *)&this->AppleArchSysroots,
                              (key_type *)
                              ((long)&((cpath.
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus).
                                      _M_p + lVar9));
        std::__cxx11::string::_M_assign((string *)pmVar7);
        lVar9 = lVar9 + 0x20;
      }
    }
    else {
      cmStrCat<char_const(&)[30],std::__cxx11::string_const&,char_const(&)[55],std::__cxx11::string_const&>
                (&e,(char (*) [30])"CMAKE_APPLE_ARCH_SYSROOTS:\n  ",cVar4.Value,
                 (char (*) [55])"\nis not the same length as CMAKE_OSX_ARCHITECTURES:\n  ",psVar6);
      IssueMessage(this,FATAL_ERROR,&e);
      std::__cxx11::string::~string((string *)&e);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&sysroots.Values);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&cpath);
  }
  for (pbVar11 = enabledLanguages.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      pbVar11 !=
      enabledLanguages.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish; pbVar11 = pbVar11 + 1) {
    bVar3 = std::operator==(pbVar11,"NONE");
    if (!bVar3) {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&cpath,
                     "CMAKE_",pbVar11);
      std::operator+(&e,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&cpath,
                     "_COMPILER");
      pmVar5 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](&this->Compilers,&e);
      std::__cxx11::string::_M_assign((string *)pmVar5);
      std::__cxx11::string::~string((string *)&e);
      std::__cxx11::string::~string((string *)&cpath);
      pcVar2 = this->Makefile;
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&cpath,
                     "CMAKE_",pbVar11);
      std::operator+(&e,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&cpath,
                     "_COMPILER");
      cmMakefile::GetSafeDefinition(pcVar2,&e);
      std::operator+(&local_110,"CMAKE_",pbVar11);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&sysroots,
                     &local_110,"_COMPILER");
      pmVar5 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](this_00,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)&sysroots);
      std::__cxx11::string::_M_assign((string *)pmVar5);
      std::__cxx11::string::~string((string *)&sysroots);
      std::__cxx11::string::~string((string *)&local_110);
      std::__cxx11::string::~string((string *)&e);
      std::__cxx11::string::~string((string *)&cpath);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&cpath,
                     "CMAKE_",pbVar11);
      std::operator+(&e,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&cpath,
                     "_COMPILER_ARG1");
      std::__cxx11::string::~string((string *)&cpath);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&sysroots,
                     "CMAKE_",pbVar11);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&cpath,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&sysroots,
                     "_COMPILER_TARGET");
      std::__cxx11::string::~string((string *)&sysroots);
      std::operator+(&local_110,"CMAKE_",pbVar11);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&sysroots,
                     &local_110,"_COMPILE_OPTIONS_TARGET");
      std::__cxx11::string::~string((string *)&local_110);
      std::operator+(&local_90,"CMAKE_",pbVar11);
      std::operator+(&local_110,&local_90,"_COMPILER_EXTERNAL_TOOLCHAIN");
      std::__cxx11::string::~string((string *)&local_90);
      std::operator+(&local_b0,"CMAKE_",pbVar11);
      std::operator+(&local_90,&local_b0,"_COMPILE_OPTIONS_EXTERNAL_TOOLCHAIN");
      std::__cxx11::string::~string((string *)&local_b0);
      std::operator+(&replaceVar,"CMAKE_",pbVar11);
      std::operator+(&local_b0,&replaceVar,"_COMPILE_OPTIONS_SYSROOT");
      std::__cxx11::string::~string((string *)&replaceVar);
      cmMakefile::GetSafeDefinition(this->Makefile,&e);
      pmVar5 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](this_00,&e);
      std::__cxx11::string::_M_assign((string *)pmVar5);
      cmMakefile::GetSafeDefinition(this->Makefile,(string *)&cpath);
      pmVar5 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](this_00,(key_type *)&cpath);
      std::__cxx11::string::_M_assign((string *)pmVar5);
      cmMakefile::GetSafeDefinition(this->Makefile,(string *)&sysroots);
      pmVar5 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](this_00,(key_type *)&sysroots);
      std::__cxx11::string::_M_assign((string *)pmVar5);
      cmMakefile::GetSafeDefinition(this->Makefile,&local_110);
      pmVar5 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](this_00,&local_110);
      std::__cxx11::string::_M_assign((string *)pmVar5);
      cmMakefile::GetSafeDefinition(this->Makefile,&local_90);
      pmVar5 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](this_00,&local_90);
      std::__cxx11::string::_M_assign((string *)pmVar5);
      cmMakefile::GetSafeDefinition(this->Makefile,&local_b0);
      pmVar5 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](this_00,&local_b0);
      std::__cxx11::string::_M_assign((string *)pmVar5);
      for (lVar9 = 0; lVar9 != 0x98; lVar9 = lVar9 + 8) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&replaceVar,*(char **)((long)&_ZGRL15ruleReplaceVars_ + lVar9),
                   (allocator<char> *)&local_50);
        lVar8 = std::__cxx11::string::find((char *)&replaceVar,0x7955a2);
        if (lVar8 != -1) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_50,"${LANG}",&local_14a);
          cmsys::SystemTools::ReplaceString(&replaceVar,&local_50,pbVar11);
          std::__cxx11::string::~string((string *)&local_50);
        }
        cmMakefile::GetSafeDefinition(this->Makefile,&replaceVar);
        pmVar5 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[](this_00,&replaceVar);
        std::__cxx11::string::_M_assign((string *)pmVar5);
        std::__cxx11::string::~string((string *)&replaceVar);
      }
      std::__cxx11::string::~string((string *)&local_b0);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_110);
      std::__cxx11::string::~string((string *)&sysroots);
      std::__cxx11::string::~string((string *)&cpath);
      std::__cxx11::string::~string((string *)&e);
    }
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&enabledLanguages);
  return;
}

Assistant:

cmLocalGenerator::cmLocalGenerator(cmGlobalGenerator* gg, cmMakefile* makefile)
  : cmOutputConverter(makefile->GetStateSnapshot())
  , DirectoryBacktrace(makefile->GetBacktrace())
{
  this->GlobalGenerator = gg;

  this->Makefile = makefile;

  this->AliasTargets = makefile->GetAliasTargets();

  this->EmitUniversalBinaryFlags = true;
  this->BackwardsCompatibility = 0;
  this->BackwardsCompatibilityFinal = false;

  this->ComputeObjectMaxPath();

  // Canonicalize entries of the CPATH environment variable the same
  // way detection of CMAKE_<LANG>_IMPLICIT_INCLUDE_DIRECTORIES does.
  {
    std::vector<std::string> cpath;
    cmSystemTools::GetPath(cpath, "CPATH");
    for (std::string const& cp : cpath) {
      if (cmSystemTools::FileIsFullPath(cp)) {
        this->EnvCPATH.emplace_back(cmSystemTools::CollapseFullPath(cp));
      }
    }
  }

  std::vector<std::string> enabledLanguages =
    this->GetState()->GetEnabledLanguages();

  if (cmValue sysrootCompile =
        this->Makefile->GetDefinition("CMAKE_SYSROOT_COMPILE")) {
    this->CompilerSysroot = *sysrootCompile;
  } else {
    this->CompilerSysroot = this->Makefile->GetSafeDefinition("CMAKE_SYSROOT");
  }

  if (cmValue sysrootLink =
        this->Makefile->GetDefinition("CMAKE_SYSROOT_LINK")) {
    this->LinkerSysroot = *sysrootLink;
  } else {
    this->LinkerSysroot = this->Makefile->GetSafeDefinition("CMAKE_SYSROOT");
  }

  // OSX SYSROOT can be required by some tools, like tapi
  {
    cmValue osxSysroot = this->Makefile->GetDefinition("CMAKE_OSX_SYSROOT");
    this->VariableMappings["CMAKE_OSX_SYSROOT"] =
      osxSysroot.IsEmpty() ? "/" : this->EscapeForShell(*osxSysroot, true);
  }

  if (cmValue appleArchSysroots =
        this->Makefile->GetDefinition("CMAKE_APPLE_ARCH_SYSROOTS")) {
    std::string const& appleArchs =
      this->Makefile->GetSafeDefinition("CMAKE_OSX_ARCHITECTURES");
    cmList archs(appleArchs);
    cmList sysroots{ appleArchSysroots, cmList::EmptyElements::Yes };
    if (archs.size() == sysroots.size()) {
      for (cmList::size_type i = 0; i < archs.size(); ++i) {
        this->AppleArchSysroots[archs[i]] = sysroots[i];
      }
    } else {
      std::string const e =
        cmStrCat("CMAKE_APPLE_ARCH_SYSROOTS:\n  ", *appleArchSysroots,
                 "\n"
                 "is not the same length as CMAKE_OSX_ARCHITECTURES:\n  ",
                 appleArchs);
      this->IssueMessage(MessageType::FATAL_ERROR, e);
    }
  }

  for (std::string const& lang : enabledLanguages) {
    if (lang == "NONE") {
      continue;
    }
    this->Compilers["CMAKE_" + lang + "_COMPILER"] = lang;

    this->VariableMappings["CMAKE_" + lang + "_COMPILER"] =
      this->Makefile->GetSafeDefinition("CMAKE_" + lang + "_COMPILER");

    std::string const& compilerArg1 = "CMAKE_" + lang + "_COMPILER_ARG1";
    std::string const& compilerTarget = "CMAKE_" + lang + "_COMPILER_TARGET";
    std::string const& compilerOptionTarget =
      "CMAKE_" + lang + "_COMPILE_OPTIONS_TARGET";
    std::string const& compilerExternalToolchain =
      "CMAKE_" + lang + "_COMPILER_EXTERNAL_TOOLCHAIN";
    std::string const& compilerOptionExternalToolchain =
      "CMAKE_" + lang + "_COMPILE_OPTIONS_EXTERNAL_TOOLCHAIN";
    std::string const& compilerOptionSysroot =
      "CMAKE_" + lang + "_COMPILE_OPTIONS_SYSROOT";

    this->VariableMappings[compilerArg1] =
      this->Makefile->GetSafeDefinition(compilerArg1);
    this->VariableMappings[compilerTarget] =
      this->Makefile->GetSafeDefinition(compilerTarget);
    this->VariableMappings[compilerOptionTarget] =
      this->Makefile->GetSafeDefinition(compilerOptionTarget);
    this->VariableMappings[compilerExternalToolchain] =
      this->Makefile->GetSafeDefinition(compilerExternalToolchain);
    this->VariableMappings[compilerOptionExternalToolchain] =
      this->Makefile->GetSafeDefinition(compilerOptionExternalToolchain);
    this->VariableMappings[compilerOptionSysroot] =
      this->Makefile->GetSafeDefinition(compilerOptionSysroot);

    for (std::string replaceVar : ruleReplaceVars) {
      if (replaceVar.find("${LANG}") != std::string::npos) {
        cmSystemTools::ReplaceString(replaceVar, "${LANG}", lang);
      }

      this->VariableMappings[replaceVar] =
        this->Makefile->GetSafeDefinition(replaceVar);
    }
  }
}